

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

FunctionSignature * __thiscall
Jinx::Impl::Parser::ParseFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Parser *this,VisibilityType scope,
          SignatureParseMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  pointer pcVar3;
  Symbol *pSVar4;
  size_type sVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  _Vector_impl_data *p_Var10;
  ulong uVar11;
  bool bVar12;
  size_type __n;
  char *format;
  pointer pbVar13;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String paramName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> n;
  FunctionSignatureParts signatureParts;
  FunctionSignaturePart part;
  int local_184;
  int local_178;
  String local_170;
  int local_14c;
  ulong local_148;
  VisibilityType local_140;
  SignatureParseMode local_13c;
  long *local_138;
  ulong local_130;
  long local_128 [2];
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  local_118;
  undefined1 local_f8 [160];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  local_58;
  
  local_13c = mode;
  if (((this->m_error == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      pSVar2 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == NewLine)) {
    Error<>(this,"Empty function signature");
    (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
    __return_storage_ptr__->m_id = 0;
    __return_storage_ptr__->m_visibility = Local;
    (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_libraryName).field_2;
    (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
    (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_118.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->m_libraryName).field_2;
    p_Var10 = &(__return_storage_ptr__->m_parts).
               super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
               ._M_impl.super__Vector_impl_data;
    local_14c = 0;
    local_148 = 0;
    local_178 = 0;
    local_184 = 0;
    bVar12 = false;
    bVar8 = false;
    local_140 = scope;
    do {
      if (this->m_error == false) {
        pSVar2 = (this->m_currentSymbol)._M_current;
        if ((pSVar2 != (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) && (pSVar2->type == NewLine)) {
          if ((bVar12 || local_184 != 1) ||
             ((long)local_118.
                    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_118.
                    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0xc0)) {
            if (local_184 != local_14c) {
              FunctionSignature::FunctionSignature
                        (__return_storage_ptr__,local_140,
                         &((this->m_library).
                           super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_name,&local_118);
              break;
            }
            format = "Function signature must have at least one non-optional name part";
          }
          else {
            format = "Function signature cannot match keyword";
          }
          Error<>(this,format);
          (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
          __return_storage_ptr__->m_id = 0;
          __return_storage_ptr__->m_visibility = Local;
          (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
          (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
          (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->m_parts).
          super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
          (__return_storage_ptr__->m_parts).
          super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->m_parts).
          super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->m_parts).
          super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          break;
        }
        local_f8._128_8_ = local_f8;
        local_f8._144_4_ = Name;
        local_f8[0x94] = false;
        local_f8._152_4_ = Any;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar2 = (this->m_currentSymbol)._M_current;
        if ((pSVar2 == (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != CurlyOpen)) {
          pSVar2 = (this->m_currentSymbol)._M_current;
          if ((pSVar2 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != ParenOpen)
             ) goto LAB_00129ec6;
          this->m_lastLine = pSVar2->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar2 + 1;
          local_f8[0x94] = true;
          goto LAB_00129ec8;
        }
        this->m_lastLine = pSVar2->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar2 + 1;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8._128_8_;
        if (bVar8) {
          Error<>(this,"Functions cannot have multiple variables without a name separating them");
        }
        else if ((local_184 == 0) || (local_178 < (int)local_148)) {
          local_f8._144_4_ = Parameter;
          pSVar4 = (this->m_currentSymbol)._M_current;
          if (((this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish != pSVar4) &&
             ((uVar11 = (ulong)pSVar4->type, uVar11 < 0x3f &&
              ((0x40308c0c80000000U >> (uVar11 & 0x3f) & 1) != 0)))) {
            local_f8._152_4_ = ParseValueType(this);
          }
          if (((this->m_error == false) &&
              (pSVar2 = (this->m_currentSymbol)._M_current,
              pSVar2 != (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == NameValue)
             ) {
            local_138 = (long *)CONCAT44(local_138._4_4_,0x13);
            symbols._M_len = 1;
            symbols._M_array = (iterator)&local_138;
            ParseMultiName_abi_cxx11_(&local_170,this,symbols);
            bVar7 = Library::PropertyNameExists
                              ((this->m_library).
                               super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&local_170);
            if (bVar7) {
              local_138 = (long *)local_170._M_dataplus._M_p;
              Error<char_const*>(this,
                                 "Function parameter name \'%s\' already exists as a property name",
                                 (char **)&local_138);
              (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
              __return_storage_ptr__->m_id = 0;
              __return_storage_ptr__->m_visibility = Local;
              (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
              (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
              (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              p_Var10->_M_start = (pointer)0x0;
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ::push_back(&local_58,&local_170);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              MemFree(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
            }
            if (bVar7) {
LAB_0012a19a:
              bVar7 = false;
            }
            else {
LAB_0012a378:
              bVar8 = true;
              local_148 = 0;
              Expect(this,CurlyClose,(char *)0x0);
              local_178 = 0;
LAB_0012a1d1:
              bVar7 = true;
              std::
              vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
              ::push_back(&local_118,(value_type *)local_f8);
            }
            goto LAB_0012a1e9;
          }
          if (local_13c != FunctionDefinition) goto LAB_0012a378;
          Error<>(this,"No variable name found in function signature");
        }
        else {
          Error<>(this,"Arguments can\'t be separated soley by optional parameters");
        }
LAB_0012a0a6:
        (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
        bVar7 = false;
        __return_storage_ptr__->m_id = 0;
        __return_storage_ptr__->m_visibility = Local;
        (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
        (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
        (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->m_parts).
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
        (__return_storage_ptr__->m_parts).
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var10->_M_start = (pointer)0x0;
        (__return_storage_ptr__->m_parts).
        super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
LAB_00129ec6:
        local_f8[0x94] = false;
LAB_00129ec8:
        local_f8._128_8_ = local_f8;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8._152_4_ = Any;
        local_f8._144_4_ = Name;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
        ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8._128_8_;
        bVar7 = CheckFunctionNamePart(this);
        if (!bVar7) {
          Error<>(this,"Invalid name in function signature");
          goto LAB_0012a0a6;
        }
        bVar7 = IsKeyword(((this->m_currentSymbol)._M_current)->type);
        if (!bVar7) {
          bVar12 = true;
        }
        local_f8._144_4_ = Name;
        ParseFunctionNamePart_abi_cxx11_(&local_170,this);
        std::
        vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
        ::
        emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>
                  ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
                    *)&local_58,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          MemFree(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        local_184 = local_184 + 1;
        local_148 = (ulong)((int)local_148 + 1);
        do {
          if (((this->m_error != false) ||
              (pSVar2 = (this->m_currentSymbol)._M_current,
              pSVar2 == (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish)) ||
             (pSVar2->type != ForwardSlash)) {
            if (local_f8[0x94] == true) {
              bVar7 = Expect(this,ParenClose,(char *)0x0);
              local_14c = local_14c + 1;
              local_178 = local_178 + 1;
              if (!bVar7) {
                Error<>(this,"Expected closing parentheses for optional function name part");
                goto LAB_0012a0a6;
              }
            }
            bVar8 = false;
            goto LAB_0012a1d1;
          }
          this->m_lastLine = pSVar2->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar2 + 1;
          bVar7 = CheckFunctionNamePart(this);
          if (!bVar7) {
            Error<>(this,"Invalid name in function signature");
            goto LAB_0012a0a6;
          }
          ParseFunctionNamePart_abi_cxx11_(&local_170,this);
          pbVar6 = local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar13 = local_58.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar6;
              pbVar13 = pbVar13 + 1) {
            pcVar3 = (pbVar13->_M_dataplus)._M_p;
            local_138 = local_128;
            std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                                &local_138,pcVar3,pcVar3 + pbVar13->_M_string_length);
            uVar11 = local_130;
            sVar5 = local_170._M_string_length;
            __n = local_130;
            if (local_170._M_string_length < local_130) {
              __n = local_170._M_string_length;
            }
            if (__n == 0) {
              bVar7 = true;
            }
            else {
              iVar9 = bcmp(local_138,local_170._M_dataplus._M_p,__n);
              bVar7 = iVar9 == 0;
            }
            if (!(bool)(bVar7 ^ 1U | uVar11 != sVar5)) {
              Error<>(this,"Duplicate alternative name in function signature");
              (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
              __return_storage_ptr__->m_id = 0;
              __return_storage_ptr__->m_visibility = Local;
              (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
              (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
              (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              p_Var10->_M_start = (pointer)0x0;
              (__return_storage_ptr__->m_parts).
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              if (local_138 != local_128) {
                MemFree(local_138,local_128[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                MemFree(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0012a19a;
            }
            if (local_138 != local_128) {
              MemFree(local_138,local_128[0] + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
          ::push_back(&local_58,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            MemFree(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        } while (pbVar13 == pbVar6);
        bVar7 = false;
      }
LAB_0012a1e9:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ::~vector(&local_58);
    } while (bVar7);
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
    ~vector(&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Parser::ParseFunctionSignature(VisibilityType scope, SignatureParseMode mode)
	{
		if (Check(SymbolType::NewLine))
		{
			Error("Empty function signature");
			return FunctionSignature();
		}
		bool parsedParameter = false;
		bool parsedNonKeywordName = false;
		int parsedNameCount = 0;
		int optionalNameCount = 0;
		int parsedNameCountSection = 0;
		int optionalNameCountSection = 0;
		FunctionSignatureParts signatureParts;
		while (!Check(SymbolType::NewLine))
		{
			FunctionSignaturePart part;
			if (Accept(SymbolType::CurlyOpen))
			{
				if (parsedParameter)
				{
					Error("Functions cannot have multiple variables without a name separating them");
					return FunctionSignature();
				}
				if (parsedNameCount && parsedNameCountSection <= optionalNameCountSection)
				{
					Error("Arguments can't be separated soley by optional parameters");
					return FunctionSignature();
				}
				part.partType = FunctionSignaturePartType::Parameter;
				if (CheckValueType())
				{
					part.valueType = ParseValueType();
				}
				if (CheckName())
				{
					String paramName = ParseMultiName({ SymbolType::CurlyClose });
					if (m_library->PropertyNameExists(paramName))
					{
						Error("Function parameter name '%s' already exists as a property name", paramName.c_str());
						return FunctionSignature();
					}
					part.names.push_back(paramName);
				}
				else if (mode == SignatureParseMode::FunctionDefinition)
				{
					Error("No variable name found in function signature");
					return FunctionSignature();
				}
				Expect(SymbolType::CurlyClose);
				parsedParameter = true;
				parsedNameCountSection = 0;
				optionalNameCountSection = 0;
			}
			else
			{
				part.optional = Accept(SymbolType::ParenOpen);
				if (!CheckFunctionNamePart())
				{
					Error("Invalid name in function signature");
					return FunctionSignature();
				}
				parsedNameCount++;
				parsedNameCountSection++;
				if (IsKeyword(m_currentSymbol->type) == false)
					parsedNonKeywordName = true;
				part.partType = FunctionSignaturePartType::Name;
				part.names.push_back(ParseFunctionNamePart());
				while (Accept(SymbolType::ForwardSlash))
				{
					if (!CheckFunctionNamePart())
					{
						Error("Invalid name in function signature");
						return FunctionSignature();
					}
					auto name = ParseFunctionNamePart();
					for (auto n : part.names)
					{
						if (n == name)
						{
							Error("Duplicate alternative name in function signature");
							return FunctionSignature();
						}
					}
					part.names.push_back(name);
				}
				if (part.optional)
				{
					optionalNameCount++;
					optionalNameCountSection++;
					if (!Expect(SymbolType::ParenClose))
					{
						Error("Expected closing parentheses for optional function name part");
						return FunctionSignature();
					}
				}
				parsedParameter = false;
			}
			signatureParts.push_back(part);
		}

		// Check for function signature validity with matching keywords
		if (!parsedNonKeywordName)
		{
			if (parsedNameCount == 1 && signatureParts.size() == 1)
			{
				Error("Function signature cannot match keyword");
				return FunctionSignature();
			}
		}

		// Check to make sure the function has at least one non-optional keyword part
		if (parsedNameCount == optionalNameCount)
		{
			Error("Function signature must have at least one non-optional name part");
			return FunctionSignature();
		}

		// Create and return the function signature
		return FunctionSignature(scope, m_library->GetName(), signatureParts);
	}